

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

void lesshungry(int num)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  obj *food;
  
  u.uhunger = num + u.uhunger;
  if (u.uhunger < 2000) {
    if ((0x5db < u.uhunger) && ((~victual._20_1_ & 6) != 0)) {
      pline("You\'re having a hard time getting all of it down.");
      nomovemsg = "You\'re finally finished.";
      if ((victual._20_1_ & 4) == 0) {
        multi = -2;
      }
      else {
        bVar3 = victual._20_1_ | 2;
        bVar1 = victual._20_1_ & 1;
        victual._20_1_ = bVar3;
        if (((bVar1 != 0) && (1 < victual.reqtime)) &&
           (cVar2 = yn_function("Stop eating?","yn",'y'), cVar2 == 'y')) {
          if ((victual._20_1_ & 0xc) == 4) {
            victual._20_1_ = victual._20_1_ | 8;
          }
          nomovemsg = (char *)0x0;
        }
      }
    }
  }
  else if (occupation == eatfood || (force_save_hs & 1) != 0) {
    if (((victual._20_1_ & 1) != 0) && (choke(victual.piece), (victual._20_1_ & 0xc) == 4)) {
      victual._20_1_ = victual._20_1_ | 8;
    }
  }
  else {
    food = tin.tin;
    if (occupation != opentin) {
      food = (obj *)0x0;
    }
    choke(food);
  }
  newuhs('\0');
  return;
}

Assistant:

void lesshungry(int num)
{
	/* See comments in newuhs() for discussion on force_save_hs */
	boolean iseating = (occupation == eatfood) || force_save_hs;

	u.uhunger += num;
	if (u.uhunger >= 2000) {
	    if (!iseating || victual.canchoke) {
		if (iseating) {
		    choke(victual.piece);
		    reset_eat();
		} else
		    choke(occupation == opentin ? tin.tin : NULL);
		/* no reset_eat() */
	    }
	} else {
	    /* Have lesshungry() report when you're nearly full so all eating
	     * warns when you're about to choke.
	     */
	    if (u.uhunger >= 1500) {
		if (!victual.eating || (victual.eating && !victual.fullwarn)) {
		    pline("You're having a hard time getting all of it down.");
		    nomovemsg = "You're finally finished.";
		    if (!victual.eating)
			multi = -2;
		    else {
			victual.fullwarn = TRUE;
			if (victual.canchoke && victual.reqtime > 1) {
			    /* a one-gulp food will not survive a stop */
			    if (yn_function("Stop eating?",ynchars,'y')=='y') {
				reset_eat();
				nomovemsg = NULL;
			    }
			}
		    }
		}
	    }
	}
	newuhs(FALSE);
}